

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

stbi_uc * stbi__resample_row_v_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  ulong uVar1;
  
  if (0 < w) {
    uVar1 = 0;
    do {
      out[uVar1] = (stbi_uc)((uint)in_near[uVar1] + (uint)in_near[uVar1] * 2 + (uint)in_far[uVar1] +
                             2 >> 2);
      uVar1 = uVar1 + 1;
    } while ((uint)w != uVar1);
  }
  return out;
}

Assistant:

static stbi_uc* stbi__resample_row_v_2(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate two samples vertically for every one in input
   int i;
   STBI_NOTUSED(hs);
   for (i=0; i < w; ++i)
      out[i] = stbi__div4(3*in_near[i] + in_far[i] + 2);
   return out;
}